

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Signal_PDU::GetData(Signal_PDU *this,KOCTET *D,KUINT16 Length)

{
  ushort uVar1;
  KException *this_00;
  ulong uVar2;
  KString local_40;
  
  uVar1 = this->m_ui16DataLength;
  if (uVar1 <= Length) {
    if (7 < uVar1) {
      uVar2 = 0;
      do {
        D[uVar2] = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 >> 3 != uVar2);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GetData","");
  KException::KException(this_00,&local_40,1);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Signal_PDU::GetData(KOCTET *D, KUINT16 Length) const noexcept(false)
{
    if( Length < m_ui16DataLength )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    // Only return the data, not any padding that may have been added.
    KUINT16 uiDataSz = m_ui16DataLength / 8;
    for( KUINT16 i = 0; i < uiDataSz; ++i )
    {
        D[i] = m_vData[i];
    }
}